

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall
amrex::EB2::Level::fillFaceCent(Level *this,Array<MultiCutFab_*,_3> *a_facecent,Geometry *geom)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Geometry *this_00;
  BoxArray *bxs;
  Level *in_RDI;
  Periodicity PVar4;
  MultiFab tmp;
  MultiCutFab *facecent;
  int idim_1;
  int idim;
  size_type in_stack_fffffffffffffd98;
  undefined1 *val;
  undefined4 uVar5;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 dst_nghost;
  undefined8 period;
  undefined4 op;
  Real in_stack_fffffffffffffed0;
  RefID in_stack_fffffffffffffed8;
  DataAllocator in_stack_ffffffffffffff00;
  MultiCutFab *in_stack_ffffffffffffff08;
  int local_20;
  int local_1c;
  
  bVar1 = isAllRegular(in_RDI);
  if (bVar1) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98);
      MultiCutFab::setVal((MultiCutFab *)in_stack_fffffffffffffed8.data,in_stack_fffffffffffffed0);
    }
  }
  else {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      std::array<amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98);
      this_00 = (Geometry *)MultiCutFab::boxArray((MultiCutFab *)0x14a5bda);
      bxs = (BoxArray *)MultiCutFab::DistributionMap((MultiCutFab *)0x14a5bec);
      iVar2 = MultiCutFab::nComp((MultiCutFab *)0x14a5bfe);
      iVar3 = MultiCutFab::nGrow((MultiCutFab *)0x14a5c0f);
      period = (Periodicity *)0x0;
      op = COPY;
      MFInfo::MFInfo((MFInfo *)0x14a5c44);
      dst_nghost = 0;
      val = &stack0xfffffffffffffe20;
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffda0);
      MultiFab::MultiFab((MultiFab *)CONCAT44(iVar3,iVar2),bxs,(DistributionMapping *)this_00,
                         (int)((ulong)val >> 0x20),(int)val,
                         (MFInfo *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                         (FabFactory<amrex::FArrayBox> *)in_RDI);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x14a5ca1);
      MFInfo::~MFInfo((MFInfo *)0x14a5cae);
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffda0,(value_type)val);
      std::array<amrex::MultiFab,_3UL>::operator[]
                ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffda0,(size_type)val);
      uVar5 = (undefined4)((ulong)val >> 0x20);
      in_stack_fffffffffffffdc4 = MultiCutFab::nComp((MultiCutFab *)0x14a5ceb);
      iVar2 = MultiCutFab::nGrow((MultiCutFab *)0x14a5cfc);
      PVar4 = Geometry::periodicity(this_00);
      in_stack_fffffffffffffda0 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffffe08;
      in_stack_fffffffffffffd98 = CONCAT44(uVar5,iVar2);
      FabArray<amrex::FArrayBox>::ParallelCopy
                (PVar4.period.vect._0_8_,
                 (FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffe04,PVar4.period.vect[2]),PVar4.period.vect[1],
                 PVar4.period.vect[0],(int)((ulong)in_RDI >> 0x20),(int)in_RDI,dst_nghost,
                 (Periodicity *)period,op);
      anon_unknown_2::copyMultiFabToMultiCutFab
                (in_stack_ffffffffffffff08,(MultiFab *)in_stack_ffffffffffffff00.m_arena);
      MultiFab::~MultiFab((MultiFab *)0x14a5d87);
    }
  }
  return;
}

Assistant:

void
Level::fillFaceCent (Array<MultiCutFab*,AMREX_SPACEDIM> const& a_facecent, const Geometry& geom) const
{
    if (isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            a_facecent[idim]->setVal(0.0);
        }
        return;
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        MultiCutFab& facecent = *a_facecent[idim];
        MultiFab tmp(facecent.boxArray(), facecent.DistributionMap(),
                     facecent.nComp(), facecent.nGrow());
        tmp.setVal(0.0);
        tmp.ParallelCopy(m_facecent[idim],0,0,facecent.nComp(),
                         0,facecent.nGrow(),geom.periodicity());
        copyMultiFabToMultiCutFab(facecent,tmp);
    }
}